

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int expansion_sum_zeroelim2(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)elen;
  if (elen < 1) {
    uVar3 = uVar5;
  }
  iVar1 = 0;
  dVar7 = *f;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    dVar8 = dVar7 + e[uVar5];
    dVar7 = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (e[uVar5] - (dVar8 - dVar7));
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      h[iVar1] = dVar7;
      iVar1 = iVar1 + 1;
    }
    dVar7 = dVar8;
  }
  h[iVar1] = dVar7;
  for (lVar2 = 1; lVar2 < flen; lVar2 = lVar2 + 1) {
    lVar4 = (long)iVar1;
    iVar1 = 0;
    dVar7 = f[lVar2];
    for (lVar6 = 0; lVar6 <= lVar4; lVar6 = lVar6 + 1) {
      dVar8 = dVar7 + h[lVar6];
      dVar7 = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (h[lVar6] - (dVar8 - dVar7));
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        h[iVar1] = dVar7;
        iVar1 = iVar1 + 1;
      }
      dVar7 = dVar8;
    }
    h[iVar1] = dVar7;
  }
  return iVar1 + 1;
}

Assistant:

int expansion_sum_zeroelim2(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q, hh;
  INEXACT REAL Qnew;
  int eindex, findex, hindex, hlast;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  hindex = 0;
  Q = f[0];
  for (eindex = 0; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Sum(Q, enow, Qnew, hh);
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    hindex = 0;
    Q = f[findex];
    for (eindex = 0; eindex <= hlast; eindex++) {
      enow = h[eindex];
      Two_Sum(Q, enow, Qnew, hh);
      Q = Qnew;
      if (hh != 0) {
        h[hindex++] = hh;
      }
    }
    h[hindex] = Q;
    hlast = hindex;
  }
  return hlast + 1;
}